

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_schema_entry.cpp
# Opt level: O1

optional_ptr<duckdb::CatalogEntry,_true> __thiscall
duckdb::DuckSchemaEntry::CreateFunction
          (DuckSchemaEntry *this,CatalogTransaction transaction,CreateFunctionInfo *info)

{
  bool bVar1;
  _Head_base<0UL,_duckdb::StandardEntry_*,_false> _Var2;
  _Alloc_hider _Var3;
  CatalogSet *this_00;
  optional_ptr<duckdb::CatalogEntry,_true> oVar4;
  type pAVar5;
  pointer pSVar6;
  InternalException *this_01;
  CatalogType type;
  unique_ptr<duckdb::StandardEntry,_std::default_delete<duckdb::StandardEntry>,_true> function;
  unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> alter_info;
  _Head_base<0UL,_duckdb::StandardEntry_*,_false> local_a8;
  string local_a0;
  _Head_base<0UL,_duckdb::StandardEntry_*,_false> local_80;
  DatabaseInstance *local_78;
  ClientContext *pCStack_70;
  Transaction *local_68;
  transaction_t tStack_60;
  transaction_t local_58;
  string local_50;
  
  if ((info->super_CreateInfo).on_conflict == ALTER_ON_CONFLICT) {
    this_00 = GetCatalogSet(this,(info->super_CreateInfo).super_ParseInfo.field_0x9);
    oVar4 = CatalogSet::GetEntry(this_00,transaction,&info->name);
    if (oVar4.ptr != (CatalogEntry *)0x0) {
      (*(info->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[4])(&local_a0,info);
      local_58 = transaction.start_time;
      local_68 = transaction.transaction.ptr;
      tStack_60 = transaction.transaction_id;
      local_78 = transaction.db.ptr;
      pCStack_70 = transaction.context.ptr;
      pAVar5 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::
               operator*((unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>
                          *)&local_a0);
      (*(this->super_SchemaCatalogEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry
        [0x20])(this,pAVar5);
      if ((long *)local_a0._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_a0._M_dataplus._M_p + 8))();
      }
      if (oVar4.ptr != (CatalogEntry *)0x0) {
        return (optional_ptr<duckdb::CatalogEntry,_true>)(CatalogEntry *)0x0;
      }
    }
  }
  local_a8._M_head_impl = (StandardEntry *)0x0;
  switch((info->super_CreateInfo).super_ParseInfo.field_0x9) {
  case 0x19:
    make_uniq_base<duckdb::StandardEntry,duckdb::TableFunctionCatalogEntry,duckdb::Catalog&,duckdb::DuckSchemaEntry&,duckdb::CreateTableFunctionInfo&>
              ((duckdb *)&local_a0,(this->super_SchemaCatalogEntry).super_InCatalogEntry.catalog,
               this,(CreateTableFunctionInfo *)info);
    break;
  case 0x1a:
    make_uniq_base<duckdb::StandardEntry,duckdb::ScalarFunctionCatalogEntry,duckdb::Catalog&,duckdb::DuckSchemaEntry&,duckdb::CreateScalarFunctionInfo&>
              ((duckdb *)&local_a0,(this->super_SchemaCatalogEntry).super_InCatalogEntry.catalog,
               this,(CreateScalarFunctionInfo *)info);
    break;
  case 0x1b:
    make_uniq_base<duckdb::StandardEntry,duckdb::AggregateFunctionCatalogEntry,duckdb::Catalog&,duckdb::DuckSchemaEntry&,duckdb::CreateAggregateFunctionInfo&>
              ((duckdb *)&local_a0,(this->super_SchemaCatalogEntry).super_InCatalogEntry.catalog,
               this,(CreateAggregateFunctionInfo *)info);
    break;
  default:
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,"Unknown function type \"%s\"","");
    CatalogTypeToString_abi_cxx11_
              (&local_50,(duckdb *)(ulong)(byte)(info->super_CreateInfo).super_ParseInfo.field_0x9,
               type);
    InternalException::InternalException<std::__cxx11::string>(this_01,&local_a0,&local_50);
    __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case 0x1e:
    make_uniq_base<duckdb::StandardEntry,duckdb::ScalarMacroCatalogEntry,duckdb::Catalog&,duckdb::DuckSchemaEntry&,duckdb::CreateMacroInfo&>
              ((duckdb *)&local_a0,(this->super_SchemaCatalogEntry).super_InCatalogEntry.catalog,
               this,(CreateMacroInfo *)info);
    break;
  case 0x1f:
    make_uniq_base<duckdb::StandardEntry,duckdb::TableMacroCatalogEntry,duckdb::Catalog&,duckdb::DuckSchemaEntry&,duckdb::CreateMacroInfo&>
              ((duckdb *)&local_a0,(this->super_SchemaCatalogEntry).super_InCatalogEntry.catalog,
               this,(CreateMacroInfo *)info);
  }
  _Var3._M_p = local_a0._M_dataplus._M_p;
  _Var2._M_head_impl = local_a8._M_head_impl;
  local_a0._M_dataplus._M_p = (pointer)0x0;
  local_a8._M_head_impl = (StandardEntry *)_Var3._M_p;
  if (_Var2._M_head_impl != (StandardEntry *)0x0) {
    (*((_Var2._M_head_impl)->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[1])();
  }
  if ((long *)local_a0._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_a0._M_dataplus._M_p + 8))();
  }
  bVar1 = (info->super_CreateInfo).internal;
  pSVar6 = unique_ptr<duckdb::StandardEntry,_std::default_delete<duckdb::StandardEntry>,_true>::
           operator->((unique_ptr<duckdb::StandardEntry,_std::default_delete<duckdb::StandardEntry>,_true>
                       *)&local_a8);
  (pSVar6->super_InCatalogEntry).super_CatalogEntry.internal = bVar1;
  local_80._M_head_impl = local_a8._M_head_impl;
  local_a8._M_head_impl = (StandardEntry *)0x0;
  oVar4 = AddEntry(this,transaction,
                   (unique_ptr<duckdb::StandardEntry,_std::default_delete<duckdb::StandardEntry>,_true>
                    *)&local_80,(info->super_CreateInfo).on_conflict);
  if (local_80._M_head_impl != (StandardEntry *)0x0) {
    (*((local_80._M_head_impl)->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[1])();
  }
  local_80._M_head_impl = (StandardEntry *)0x0;
  if (local_a8._M_head_impl != (StandardEntry *)0x0) {
    (*((local_a8._M_head_impl)->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[1])();
  }
  return (optional_ptr<duckdb::CatalogEntry,_true>)oVar4.ptr;
}

Assistant:

optional_ptr<CatalogEntry> DuckSchemaEntry::CreateFunction(CatalogTransaction transaction, CreateFunctionInfo &info) {
	if (info.on_conflict == OnCreateConflict::ALTER_ON_CONFLICT) {
		// check if the original entry exists
		auto &catalog_set = GetCatalogSet(info.type);
		auto current_entry = catalog_set.GetEntry(transaction, info.name);
		if (current_entry) {
			// the current entry exists - alter it instead
			auto alter_info = info.GetAlterInfo();
			Alter(transaction, *alter_info);
			return nullptr;
		}
	}
	unique_ptr<StandardEntry> function;
	switch (info.type) {
	case CatalogType::SCALAR_FUNCTION_ENTRY:
		function = make_uniq_base<StandardEntry, ScalarFunctionCatalogEntry>(catalog, *this,
		                                                                     info.Cast<CreateScalarFunctionInfo>());
		break;
	case CatalogType::TABLE_FUNCTION_ENTRY:
		function = make_uniq_base<StandardEntry, TableFunctionCatalogEntry>(catalog, *this,
		                                                                    info.Cast<CreateTableFunctionInfo>());
		break;
	case CatalogType::MACRO_ENTRY:
		// create a macro function
		function = make_uniq_base<StandardEntry, ScalarMacroCatalogEntry>(catalog, *this, info.Cast<CreateMacroInfo>());
		break;

	case CatalogType::TABLE_MACRO_ENTRY:
		// create a macro table function
		function = make_uniq_base<StandardEntry, TableMacroCatalogEntry>(catalog, *this, info.Cast<CreateMacroInfo>());
		break;
	case CatalogType::AGGREGATE_FUNCTION_ENTRY:
		D_ASSERT(info.type == CatalogType::AGGREGATE_FUNCTION_ENTRY);
		// create an aggregate function
		function = make_uniq_base<StandardEntry, AggregateFunctionCatalogEntry>(
		    catalog, *this, info.Cast<CreateAggregateFunctionInfo>());
		break;
	default:
		throw InternalException("Unknown function type \"%s\"", CatalogTypeToString(info.type));
	}
	function->internal = info.internal;
	return AddEntry(transaction, std::move(function), info.on_conflict);
}